

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O2

int trico_read_attributes_uint64(void *a,uint64_t **attrib)

{
  uint8_t *__ptr;
  uint8_t *__ptr_00;
  uint32_t uVar1;
  ssize_t sVar2;
  char *pcVar3;
  uint8_t *b8;
  int iVar4;
  int iVar5;
  int __fd;
  ulong uVar6;
  ulong uVar7;
  uint32_t nr_of_compressed_bytes;
  uint32_t nr_of_attribs;
  uint8_t *local_70;
  uint8_t *local_68;
  uint8_t *local_60;
  uint8_t *local_58;
  uint8_t *local_50;
  char *local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  
  iVar5 = 0;
  if (*(int *)((long)a + 0x24) == 0x14) {
    sVar2 = read((int)&nr_of_attribs,(void *)0x4,1);
    if ((int)sVar2 == 0) {
      iVar5 = 0;
    }
    else {
      __fd = (int)&nr_of_compressed_bytes;
      sVar2 = read(__fd,(void *)0x4,1);
      uVar1 = nr_of_compressed_bytes;
      iVar4 = 0;
      iVar5 = 0;
      if ((int)sVar2 != 0) {
        uVar6 = (ulong)nr_of_compressed_bytes;
        pcVar3 = (char *)malloc(uVar6);
        sVar2 = read((int)pcVar3,(void *)0x1,uVar6);
        iVar5 = iVar4;
        if ((int)sVar2 != 0) {
          uVar6 = (ulong)nr_of_attribs;
          local_38 = (uint8_t *)malloc(uVar6);
          uVar1 = LZ4_decompress_safe(pcVar3,(char *)local_38,uVar1,nr_of_attribs);
          if (uVar1 != nr_of_attribs) {
            __assert_fail("bytes_decompressed == nr_of_attribs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                          ,0x633,"int trico_read_attributes_uint64(void *, uint64_t **)");
          }
          sVar2 = read(__fd,(void *)0x4,1);
          uVar1 = nr_of_compressed_bytes;
          if ((int)sVar2 != 0) {
            uVar7 = (ulong)nr_of_compressed_bytes;
            pcVar3 = (char *)realloc(pcVar3,uVar7);
            sVar2 = read((int)pcVar3,(void *)0x1,uVar7);
            if ((int)sVar2 != 0) {
              local_40 = (uint8_t *)malloc(uVar6);
              uVar1 = LZ4_decompress_safe(pcVar3,(char *)local_40,uVar1,nr_of_attribs);
              if (uVar1 != nr_of_attribs) {
                __assert_fail("bytes_decompressed == nr_of_attribs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                              ,0x63c,"int trico_read_attributes_uint64(void *, uint64_t **)");
              }
              sVar2 = read(__fd,(void *)0x4,1);
              uVar1 = nr_of_compressed_bytes;
              if ((int)sVar2 != 0) {
                uVar7 = (ulong)nr_of_compressed_bytes;
                pcVar3 = (char *)realloc(pcVar3,uVar7);
                sVar2 = read((int)pcVar3,(void *)0x1,uVar7);
                if ((int)sVar2 != 0) {
                  local_50 = (uint8_t *)malloc(uVar6);
                  uVar1 = LZ4_decompress_safe(pcVar3,(char *)local_50,uVar1,nr_of_attribs);
                  if (uVar1 != nr_of_attribs) {
                    __assert_fail("bytes_decompressed == nr_of_attribs",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                  ,0x645,"int trico_read_attributes_uint64(void *, uint64_t **)");
                  }
                  sVar2 = read(__fd,(void *)0x4,1);
                  uVar1 = nr_of_compressed_bytes;
                  if ((int)sVar2 != 0) {
                    uVar7 = (ulong)nr_of_compressed_bytes;
                    pcVar3 = (char *)realloc(pcVar3,uVar7);
                    sVar2 = read((int)pcVar3,(void *)0x1,uVar7);
                    if ((int)sVar2 != 0) {
                      local_58 = (uint8_t *)malloc(uVar6);
                      uVar1 = LZ4_decompress_safe(pcVar3,(char *)local_58,uVar1,nr_of_attribs);
                      if (uVar1 != nr_of_attribs) {
                        __assert_fail("bytes_decompressed == nr_of_attribs",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                      ,0x64e,"int trico_read_attributes_uint64(void *, uint64_t **)"
                                     );
                      }
                      sVar2 = read(__fd,(void *)0x4,1);
                      uVar1 = nr_of_compressed_bytes;
                      if ((int)sVar2 != 0) {
                        uVar7 = (ulong)nr_of_compressed_bytes;
                        pcVar3 = (char *)realloc(pcVar3,uVar7);
                        sVar2 = read((int)pcVar3,(void *)0x1,uVar7);
                        if ((int)sVar2 != 0) {
                          local_60 = (uint8_t *)malloc(uVar6);
                          uVar1 = LZ4_decompress_safe(pcVar3,(char *)local_60,uVar1,nr_of_attribs);
                          if (uVar1 != nr_of_attribs) {
                            __assert_fail("bytes_decompressed == nr_of_attribs",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                          ,0x657,
                                          "int trico_read_attributes_uint64(void *, uint64_t **)");
                          }
                          sVar2 = read(__fd,(void *)0x4,1);
                          uVar1 = nr_of_compressed_bytes;
                          if ((int)sVar2 != 0) {
                            uVar7 = (ulong)nr_of_compressed_bytes;
                            pcVar3 = (char *)realloc(pcVar3,uVar7);
                            sVar2 = read((int)pcVar3,(void *)0x1,uVar7);
                            if ((int)sVar2 != 0) {
                              local_68 = (uint8_t *)malloc(uVar6);
                              uVar1 = LZ4_decompress_safe(pcVar3,(char *)local_68,uVar1,
                                                          nr_of_attribs);
                              if (uVar1 != nr_of_attribs) {
                                __assert_fail("bytes_decompressed == nr_of_attribs",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                              ,0x660,
                                              "int trico_read_attributes_uint64(void *, uint64_t **)"
                                             );
                              }
                              sVar2 = read(__fd,(void *)0x4,1);
                              uVar1 = nr_of_compressed_bytes;
                              if ((int)sVar2 != 0) {
                                uVar7 = (ulong)nr_of_compressed_bytes;
                                pcVar3 = (char *)realloc(pcVar3,uVar7);
                                sVar2 = read((int)pcVar3,(void *)0x1,uVar7);
                                if ((int)sVar2 != 0) {
                                  local_70 = (uint8_t *)malloc(uVar6);
                                  uVar1 = LZ4_decompress_safe(pcVar3,(char *)local_70,uVar1,
                                                              nr_of_attribs);
                                  if (uVar1 != nr_of_attribs) {
                                    __assert_fail("bytes_decompressed == nr_of_attribs",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                                  ,0x669,
                                                  "int trico_read_attributes_uint64(void *, uint64_t **)"
                                                 );
                                  }
                                  sVar2 = read(__fd,(void *)0x4,1);
                                  if ((int)sVar2 != 0) {
                                    pcVar3 = (char *)realloc(pcVar3,(ulong)nr_of_compressed_bytes);
                                    sVar2 = read((int)pcVar3,(void *)0x1,
                                                 (ulong)nr_of_compressed_bytes);
                                    if ((int)sVar2 != 0) {
                                      b8 = (uint8_t *)malloc(uVar6);
                                      local_48 = pcVar3;
                                      uVar1 = LZ4_decompress_safe(pcVar3,(char *)b8,
                                                                  nr_of_compressed_bytes,
                                                                  nr_of_attribs);
                                      __ptr_00 = local_38;
                                      __ptr = local_40;
                                      if (uVar1 != nr_of_attribs) {
                                        __assert_fail("bytes_decompressed == nr_of_attribs",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                                  ,0x672,
                                                  "int trico_read_attributes_uint64(void *, uint64_t **)"
                                                  );
                                      }
                                      if (attrib != (uint64_t **)0x0) {
                                        trico_transpose_uint64_soa_to_aos
                                                  (attrib,local_38,local_40,local_50,local_58,
                                                   local_60,local_68,local_70,b8,nr_of_attribs);
                                      }
                                      free(local_48);
                                      free(__ptr_00);
                                      free(__ptr);
                                      free(local_50);
                                      free(local_58);
                                      free(local_60);
                                      free(local_68);
                                      free(local_70);
                                      free(b8);
                                      read_next_stream_type((trico_archive *)a);
                                      iVar5 = 1;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int trico_read_attributes_uint64(void* a, uint64_t** attrib)
  {
  struct trico_archive* arch = (struct trico_archive*)a;

  if (trico_get_next_stream_type(arch) != trico_attribute_uint64_stream)
    return 0;

  uint32_t nr_of_attribs;
  if (!read(&nr_of_attribs, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b1 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint32_t bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b1, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b2 = (uint8_t*)trico_malloc(nr_of_attribs);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b2, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b3 = (uint8_t*)trico_malloc(nr_of_attribs);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b3, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b4 = (uint8_t*)trico_malloc(nr_of_attribs);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b4, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b5 = (uint8_t*)trico_malloc(nr_of_attribs);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b5, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b6 = (uint8_t*)trico_malloc(nr_of_attribs);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b6, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b7 = (uint8_t*)trico_malloc(nr_of_attribs);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b7, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b8 = (uint8_t*)trico_malloc(nr_of_attribs);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b8, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (attrib != NULL)
    trico_transpose_uint64_soa_to_aos(attrib, decompressed_b1, decompressed_b2, decompressed_b3, decompressed_b4, decompressed_b5, decompressed_b6, decompressed_b7, decompressed_b8, nr_of_attribs);

  trico_free(compressed);
  trico_free(decompressed_b1);
  trico_free(decompressed_b2);
  trico_free(decompressed_b3);
  trico_free(decompressed_b4);
  trico_free(decompressed_b5);
  trico_free(decompressed_b6);
  trico_free(decompressed_b7);
  trico_free(decompressed_b8);

  read_next_stream_type(arch);

  return 1;
  }